

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::Cluster::HasBlockEntries(Segment *pSegment,longlong off,longlong *pos,long *len)

{
  IMkvReader *pReader;
  int iVar1;
  longlong lVar2;
  ulong uVar3;
  longlong lVar4;
  long lVar5;
  long lVar6;
  long local_48;
  longlong avail;
  longlong total;
  
  pReader = pSegment->m_pReader;
  iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&avail);
  if (iVar1 < 0) {
    return (long)iVar1;
  }
  lVar6 = off + pSegment->m_start;
  *pos = lVar6;
  if (lVar6 < total || total < 0) {
    if (pSegment->m_size < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = pSegment->m_size + pSegment->m_start;
    }
    if (avail <= lVar6) {
LAB_001560a5:
      *len = 1;
      return -3;
    }
    lVar2 = GetUIntLength(pReader,lVar6,len);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (lVar2 != 0) {
      return -3;
    }
    lVar6 = *len + *pos;
    if (-1 < lVar5 && lVar5 < lVar6) {
      return -2;
    }
    if (total < 0 || lVar6 <= total) {
      if (avail < lVar6) {
        return -3;
      }
      lVar2 = ReadID(pReader,*pos,len);
      if (lVar2 < 0) {
        return lVar2;
      }
      if (lVar2 != 0x1f43b675) {
        return -1;
      }
      lVar6 = *pos + *len;
      *pos = lVar6;
      if (avail <= lVar6) goto LAB_001560a5;
      lVar2 = GetUIntLength(pReader,lVar6,len);
      if (lVar2 < 0) {
        return lVar2;
      }
      if (lVar2 != 0) {
        return -3;
      }
      lVar6 = *len + *pos;
      if (-1 < lVar5 && lVar5 < lVar6) {
        return -2;
      }
      if (total < 0 || lVar6 <= total) {
        if (avail < lVar6) {
          return -3;
        }
        uVar3 = ReadUInt(pReader,*pos,len);
        if ((long)uVar3 < 0) {
          return uVar3;
        }
        if (uVar3 != 0) {
          lVar6 = *len;
          lVar2 = *pos + lVar6;
          *pos = lVar2;
          local_48 = -1;
          if ((-1L << ((char)lVar6 * '\a' & 0x3fU) ^ uVar3) != 0xffffffffffffffff) {
            local_48 = uVar3 + lVar2;
            if ((-1 < lVar5) && (lVar5 < local_48)) {
              return -2;
            }
            if ((-1 < total) && (total < local_48)) {
              return 0;
            }
          }
          while( true ) {
            if ((-1 < local_48) && (local_48 <= lVar2)) {
              return 0;
            }
            if (avail <= lVar2) break;
            lVar2 = GetUIntLength(pReader,lVar2,len);
            if (lVar2 < 0) {
              return lVar2;
            }
            if (lVar2 != 0) {
              return -3;
            }
            lVar6 = *len + *pos;
            if (-1 < local_48 && local_48 < lVar6) {
              return -2;
            }
            if (avail < lVar6) {
              return -3;
            }
            lVar4 = ReadID(pReader,*pos,len);
            if (lVar4 < 0) {
              return lVar4;
            }
            if (lVar4 == 0x1c53bb6b) {
              return 0;
            }
            if (lVar4 == 0x1f43b675) {
              return 0;
            }
            lVar6 = *pos + *len;
            *pos = lVar6;
            if (-1 < local_48 && local_48 <= lVar6) {
              return -2;
            }
            if (avail <= lVar6) break;
            lVar2 = GetUIntLength(pReader,lVar6,len);
            if (lVar2 < 0) {
              return lVar2;
            }
            if (lVar2 != 0) {
              return -3;
            }
            lVar6 = *len + *pos;
            if (-1 < local_48 && local_48 < lVar6) {
              return -2;
            }
            if (avail < lVar6) {
              return -3;
            }
            uVar3 = ReadUInt(pReader,*pos,len);
            if ((long)uVar3 < 0) {
              return uVar3;
            }
            lVar6 = *len;
            lVar2 = *pos + lVar6;
            *pos = lVar2;
            if (-1 < local_48 && local_48 < lVar2) {
              return -2;
            }
            if (uVar3 != 0) {
              if ((-1L << ((char)lVar6 * '\a' & 0x3fU) ^ uVar3) == 0xffffffffffffffff) {
                return -2;
              }
              lVar2 = lVar2 + uVar3;
              if (-1 < local_48 && local_48 < lVar2) {
                return -2;
              }
              if ((lVar4 == 0xa0) || (lVar4 == 0xa3)) {
                return 1;
              }
              *pos = lVar2;
            }
          }
          goto LAB_001560a5;
        }
      }
    }
  }
  return 0;
}

Assistant:

long Cluster::HasBlockEntries(
    const Segment* pSegment,
    long long off,  // relative to start of segment payload
    long long& pos, long& len) {
  assert(pSegment);
  assert(off >= 0);  // relative to segment

  IMkvReader* const pReader = pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  pos = pSegment->m_start + off;  // absolute

  if ((total >= 0) && (pos >= total))
    return 0;  // we don't even have a complete cluster

  const long long segment_stop =
      (pSegment->m_size < 0) ? -1 : pSegment->m_start + pSegment->m_size;

  long long cluster_stop = -1;  // interpreted later to mean "unknown size"

  {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id != libwebm::kMkvCluster)
      return E_PARSE_FAILED;

    pos += len;  // consume Cluster ID field

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + len) > total))
      return 0;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    if (size == 0)
      return 0;  // cluster does not have entries

    pos += len;  // consume size field

    // pos now points to start of payload

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size != unknown_size) {
      cluster_stop = pos + size;
      assert(cluster_stop >= 0);

      if ((segment_stop >= 0) && (cluster_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((total >= 0) && (cluster_stop > total))
        // return E_FILE_FORMAT_INVALID;  //too conservative
        return 0;  // cluster does not have any entries
    }
  }

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return 0;  // no entries detected

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // need more data
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      return 0;  // no entries found

    if (id == libwebm::kMkvCues)
      return 0;  // no entries found

    pos += len;  // consume id field

    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // read size field

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // underflow
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    // pos now points to start of payload

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;  // not supported inside cluster

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvBlockGroup)
      return 1;  // have at least one entry

    if (id == libwebm::kMkvSimpleBlock)
      return 1;  // have at least one entry

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }
}